

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmik.cpp
# Opt level: O0

void __thiscall lmik::solve(lmik *this,Vector2d *q_ref,Vector2d *X_ref)

{
  bool bVar1;
  DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *pDVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  XprTypeNested local_f0;
  Product<Eigen::Inverse<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>
  local_e8;
  undefined1 local_d8 [8];
  Vector2d g;
  Vector2d e;
  Vector2d delta_q;
  Vector2d q_new;
  Vector2d q;
  Matrix2d H;
  Matrix2d J;
  Matrix2d W_N;
  Vector2d *X_ref_local;
  Vector2d *q_ref_local;
  lmik *this_local;
  
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::Matrix
            ((Matrix<double,_2,_2,_0,_2,_2> *)
             (J.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
             + 3));
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::Matrix
            ((Matrix<double,_2,_2,_0,_2,_2> *)
             (H.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
             + 3));
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::Matrix
            ((Matrix<double,_2,_2,_0,_2,_2> *)
             (q.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
            ((Matrix<double,_2,_1,_0,_2,_1> *)
             (q_new.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
            ((Matrix<double,_2,_1,_0,_2,_1> *)
             (delta_q.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
            ((Matrix<double,_2,_1,_0,_2,_1> *)
             (e.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
            ((Matrix<double,_2,_1,_0,_2,_1> *)
             (g.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)local_d8);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=
            ((Matrix<double,_2,_1,_0,_2,_1> *)
             (q_new.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
              array + 1),q_ref);
  do {
    cal_e(this,(Vector2d *)
               (g.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                array + 1),
          (Vector2d *)
          (q_new.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
          + 1),X_ref);
    cal_J(this,(Matrix2d *)
               (H.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
                array + 3),
          (Vector2d *)
          (q_new.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
          + 1));
    cal_g(this,(Vector2d *)local_d8,
          (Matrix2d *)
          (H.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array + 3
          ),(Vector2d *)
            (g.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array +
            1));
    cal_W_N(this,(Matrix2d *)
                 (J.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
                  array + 3),
            (Vector2d *)
            (g.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array +
            1));
    cal_H(this,(Matrix2d *)
               (q.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                array + 1),
          (Matrix2d *)
          (H.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array + 3
          ),(Matrix2d *)
            (J.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array +
            3));
    local_f0 = (XprTypeNested)
               Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::inverse
                         ((MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                          (q.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                           m_data.array + 1));
    local_e8 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,2,2,0,2,2>>>::operator*
                         ((MatrixBase<Eigen::Inverse<Eigen::Matrix<double,2,2,0,2,2>>> *)&local_f0,
                          (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_d8);
    Eigen::Matrix<double,2,1,0,2,1>::operator=
              ((Matrix<double,2,1,0,2,1> *)
               (e.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                array + 1),
               (DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>_>
                *)&local_e8);
    Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)
               (q_new.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                array + 1),
               (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
               (e.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                array + 1));
    pDVar2 = (DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
             (e.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
             + 1);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()(pDVar2,0);
    std::abs((int)pDVar2);
    bVar1 = false;
    if (this->threshold <= extraout_XMM0_Qa && extraout_XMM0_Qa != this->threshold) {
      pDVar2 = (DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
               (e.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                array + 1);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()(pDVar2,1);
      std::abs((int)pDVar2);
      bVar1 = this->threshold <= extraout_XMM0_Qa_00 && extraout_XMM0_Qa_00 != this->threshold;
    }
  } while (bVar1);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=
            (q_ref,(Matrix<double,_2,_1,_0,_2,_1> *)
                   (q_new.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                    m_data.array + 1));
  return;
}

Assistant:

void lmik::solve(Vector2d& q_ref, const Vector2d& X_ref) {
    Matrix2d W_N, J, H;
    Vector2d q, q_new, delta_q, e, g; 
    q = q_ref;
    
    do {
        cal_e(e, q, X_ref);
        cal_J(J, q);
        cal_g(g, J, e);
        cal_W_N(W_N, e);
        cal_H(H, J, W_N);
        delta_q = H.inverse() * g;
        q += delta_q;
    } while(abs(delta_q(0)) > threshold && abs(delta_q(1)) > threshold);

    q_ref = q;
    return;
}